

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O3

void __thiscall
QXmlStreamReaderPrivate::raiseError(QXmlStreamReaderPrivate *this,Error error,QString *message)

{
  QArrayData *data;
  char16_t *pcVar1;
  qsizetype qVar2;
  char *sourceText;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this->error = error;
  QString::operator=(&this->errorString,message);
  if ((this->errorString).d.ptr == (char16_t *)0x0) {
    if (error == CustomError) {
      sourceText = "Invalid document.";
    }
    else {
      if (error != PrematureEndOfDocumentError) goto LAB_00390150;
      sourceText = "Premature end of document.";
    }
    QCoreApplication::translate(&local_38,"QXmlStream",sourceText,(char *)0x0,-1);
    data = &((this->errorString).d.d)->super_QArrayData;
    pcVar1 = (this->errorString).d.ptr;
    (this->errorString).d.d = local_38.d.d;
    (this->errorString).d.ptr = local_38.d.ptr;
    qVar2 = (this->errorString).d.size;
    (this->errorString).d.size = local_38.d.size;
    local_38.d.d = (Data *)data;
    local_38.d.ptr = pcVar1;
    local_38.d.size = qVar2;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
  }
LAB_00390150:
  this->type = Invalid;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamReaderPrivate::raiseError(QXmlStreamReader::Error error, const QString& message)
{
    this->error = error;
    errorString = message;
    if (errorString.isNull()) {
        if (error == QXmlStreamReader::PrematureEndOfDocumentError)
            errorString = QXmlStream::tr("Premature end of document.");
        else if (error == QXmlStreamReader::CustomError)
            errorString = QXmlStream::tr("Invalid document.");
    }

    type = QXmlStreamReader::Invalid;
}